

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O2

string * __thiscall
adios2::kvcache::QueryBox::toString_abi_cxx11_(string *__return_storage_ptr__,QueryBox *this)

{
  size_t i;
  ulong uVar1;
  string sStack_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Start_",(allocator *)&sStack_48);
  for (uVar1 = 0; uVar1 < (this->Start).super_CoreDims.DimCount; uVar1 = uVar1 + 1) {
    std::__cxx11::to_string(&sStack_48,(this->Start).super_CoreDims.DimensSpan[uVar1]);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (uVar1 != (this->Start).super_CoreDims.DimCount - 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (uVar1 = 0; uVar1 < (this->Start).super_CoreDims.DimCount; uVar1 = uVar1 + 1) {
    std::__cxx11::to_string(&sStack_48,(this->Count).super_CoreDims.DimensSpan[uVar1]);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (uVar1 != (this->Start).super_CoreDims.DimCount - 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        std::string str = "Start_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Start[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|Count_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Count[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|";
        return str;
    }